

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O2

void __thiscall r_exec::GMonitor::commit(GMonitor *this)

{
  SolutionList *pSVar1;
  _List_node_base *p_Var2;
  PrimaryMDLController *pPVar3;
  HLPBindingMap *pHVar4;
  long lVar5;
  Fact *super_goal;
  _List_node_base *p_Var6;
  bool bVar7;
  Goal *this_00;
  uint64_t now;
  _List_node_base *p_Var8;
  SimOutcomes *pSVar9;
  _List_node_base *p_Var10;
  float fVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  ulong uVar18;
  undefined1 auVar17 [16];
  long lStack_40;
  
  this_00 = _Fact::get_goal((_Fact *)(this->super__GMonitor).super_Monitor.target.object);
  now = (*Now)();
  pSVar9 = &(this->super__GMonitor).sim_failures;
  p_Var10 = (_List_node_base *)pSVar9;
  do {
    do {
      p_Var10 = (((SolutionList *)&p_Var10->_M_next)->
                super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      if ((SimOutcomes *)p_Var10 == pSVar9) {
        pSVar1 = &(this->super__GMonitor).sim_failures.optional_solutions;
        p_Var10 = (_List_node_base *)pSVar1;
        while (p_Var10 = (((_List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                            *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var10 != (_List_node_base *)pSVar1) {
          bVar7 = Sim::is_invalidated((Sim *)p_Var10[1]._M_prev);
          if (!bVar7) {
            dVar12 = Goal::get_strength((Goal *)p_Var10[1]._M_next,now);
            dVar13 = Goal::get_strength(this_00,now);
            if (dVar13 < dVar12) {
              Sim::invalidate((Sim *)p_Var10[1]._M_prev);
            }
          }
        }
        pSVar1 = &(this->super__GMonitor).sim_successes.optional_solutions;
        auVar14._8_4_ = (int)now;
        auVar14._0_8_ = now;
        auVar14._12_4_ = (int)(now >> 0x20);
        p_Var10 = (_List_node_base *)pSVar1;
        p_Var6 = (_List_node_base *)0x0;
        while (p_Var8 = p_Var6,
              p_Var10 = (((_List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                           *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var10 != (_List_node_base *)pSVar1) {
          bVar7 = Sim::is_invalidated((Sim *)p_Var10[1]._M_prev);
          p_Var6 = p_Var8;
          if ((!bVar7) &&
             (p_Var2 = p_Var10[1]._M_prev, p_Var6 = p_Var2, p_Var8 != (_List_node_base *)0x0)) {
            lStack_40 = auVar14._8_8_;
            uVar16 = (long)p_Var2[4]._M_prev - now;
            uVar18 = (long)p_Var8[4]._M_prev - lStack_40;
            auVar17._0_8_ =
                 ((double)(uVar16 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 (double)(uVar16 & 0xffffffff | 0x4330000000000000);
            auVar17._8_8_ =
                 ((double)(uVar18 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 (double)(uVar18 & 0xffffffff | 0x4330000000000000);
            auVar15._8_8_ = p_Var8[4]._M_next;
            auVar15._0_8_ = p_Var2[4]._M_next;
            auVar15 = divpd(auVar15,auVar17);
            p_Var6 = p_Var8;
            if (auVar15._8_8_ < auVar15._0_8_) {
              p_Var6 = p_Var2;
            }
          }
        }
        _GMonitor::invalidate_sim_outcomes(&this->super__GMonitor);
        if (p_Var8 != (_List_node_base *)0x0) {
          pSVar9 = &(this->super__GMonitor).sim_successes;
          pPVar3 = (PrimaryMDLController *)p_Var10[1]._M_prev[3]._M_prev;
          p_Var10 = p_Var8[2]._M_prev;
          bVar7 = *(bool *)((long)&p_Var8[1]._M_prev + 1);
          pHVar4 = (HLPBindingMap *)(this->super__GMonitor).super_Monitor.bindings.object;
          fVar11 = _Fact::get_cfd((this->super__GMonitor).goal_target);
          PrimaryMDLController::abduce(pPVar3,pHVar4,(Fact *)p_Var10,bVar7,(double)fVar11);
          p_Var10 = (_List_node_base *)pSVar9;
          while (p_Var10 = (((SolutionList *)&p_Var10->_M_next)->
                           super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                           )._M_impl._M_node.super__List_node_base._M_next,
                (SimOutcomes *)p_Var10 != pSVar9) {
            lVar5 = *(long *)((long)(p_Var10 + 1) + 8);
            super_goal = *(Fact **)(lVar5 + 0x28);
            pPVar3 = *(PrimaryMDLController **)(lVar5 + 0x38);
            bVar7 = *(bool *)(lVar5 + 0x19);
            pHVar4 = (HLPBindingMap *)(this->super__GMonitor).super_Monitor.bindings.object;
            fVar11 = _Fact::get_cfd((this->super__GMonitor).goal_target);
            PrimaryMDLController::abduce(pPVar3,pHVar4,super_goal,bVar7,(double)fVar11);
          }
        }
        return;
      }
      bVar7 = Sim::is_invalidated(*(Sim **)((long)(p_Var10 + 1) + 8));
    } while (bVar7);
    dVar12 = Goal::get_strength(*(Goal **)(p_Var10 + 1),now);
    dVar13 = Goal::get_strength(this_00,now);
  } while (dVar12 <= dVar13);
  _GMonitor::invalidate_sim_outcomes(&this->super__GMonitor);
  return;
}

Assistant:

void GMonitor::commit()   // the purpose is to invalidate damaging simulations; if anything remains, commit to all mandatory simulations and to the best optional one.
{
    Goal *monitored_goal = target->get_goal();
    uint64_t now = Now();
    SolutionList::const_iterator sol;

    for (sol = sim_failures.mandatory_solutions.begin(); sol != sim_failures.mandatory_solutions.end(); ++sol) { // check if any mandatory solution could result in the failure of more important a goal.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if ((*sol).first->get_strength(now) > monitored_goal->get_strength(now)) { // cave in.
            invalidate_sim_outcomes(); // this stops any further propagation of the goal simulation.
            return;
        }
    }

    for (sol = sim_failures.optional_solutions.begin(); sol != sim_failures.optional_solutions.end(); ++sol) { // check if any optional solutions could result in the failure of more important a goal; invalidate the culprits.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if ((*sol).first->get_strength(now) > monitored_goal->get_strength(now)) {
            (*sol).second->invalidate();
        }
    }

    Sim *best_sol = nullptr;

    for (sol = sim_successes.optional_solutions.begin(); sol != sim_successes.optional_solutions.end(); ++sol) { // find the best optional solution left.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if (!best_sol) {
            best_sol = (*sol).second;
        } else {
            double s = (*sol).second->sol_cfd / ((*sol).second->sol_before - now);
            double _s = best_sol->sol_cfd / (best_sol->sol_before - now);

            if (s > _s) {
                best_sol = (*sol).second;
            }
        }
    }

    invalidate_sim_outcomes(); // this stops any further propagation of the goal simulation.

    if (best_sol) {
        ((PrimaryMDLController *)(*sol).second->sol)->abduce(bindings, best_sol->super_goal, best_sol->opposite, goal_target->get_cfd());

        for (sol = sim_successes.mandatory_solutions.begin(); sol != sim_successes.mandatory_solutions.end(); ++sol) { // commit to all mandatory solutions.
            ((PrimaryMDLController *)(*sol).second->sol)->abduce(bindings, (*sol).second->super_goal, (*sol).second->opposite, goal_target->get_cfd());
        }
    }
}